

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O1

RemotePromise<capnp::AnyPointer> * __thiscall
capnp::LocalRequest::sendImpl
          (RemotePromise<capnp::AnyPointer> *__return_storage_ptr__,LocalRequest *this,
          bool isStreaming)

{
  CallHints CVar1;
  ushort uVar2;
  uint64_t uVar3;
  ClientHook *pCVar4;
  Promise<void> node;
  undefined4 uVar5;
  undefined4 uVar6;
  long *plVar7;
  Refcounted *refcounted;
  Fault f;
  VoidPromiseAndPipeline promiseAndPipeline;
  PromiseNode *local_38;
  void *continuationTracePtr;
  
  promiseAndPipeline.promise.super_PromiseBase.node.ptr = (PromiseBase)(this->message).ptr;
  promiseAndPipeline.pipeline.disposer = (Disposer *)0x0;
  promiseAndPipeline.pipeline.ptr = (PipelineHook *)anon_var_dwarf_44bf6;
  if (promiseAndPipeline.promise.super_PromiseBase.node.ptr == (OwnPromiseNode)0x0) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::MallocMessageBuilder*,decltype(nullptr)>&,char_const(&)[39]>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability.c++"
               ,0x109,FAILED,"message.get() != nullptr",
               "_kjCondition,\"Already called send() on this request.\"",
               (DebugComparison<capnp::MallocMessageBuilder_*,_std::nullptr_t> *)&promiseAndPipeline
               ,(char (*) [39])"Already called send() on this request.");
    kj::_::Debug::Fault::fatal(&f);
  }
  (*((this->client).ptr)->_vptr_ClientHook[4])(&promiseAndPipeline);
  plVar7 = (long *)operator_new(0xa8);
  uVar5 = promiseAndPipeline.pipeline.disposer._0_4_;
  uVar6 = promiseAndPipeline.pipeline.disposer._4_4_;
  promiseAndPipeline.pipeline.disposer = (Disposer *)0x0;
  CVar1 = this->hints;
  *(undefined4 *)(plVar7 + 3) = 0;
  *plVar7 = (long)&PTR_getParams_006f8328;
  plVar7[1] = (long)&PTR__LocalCallContext_006f8388;
  plVar7[2] = (long)&PTR_disposeImpl_006f83a8;
  plVar7[4] = (long)(this->message).disposer;
  plVar7[5] = (long)(this->message).ptr;
  (this->message).ptr = (MallocMessageBuilder *)0x0;
  *(undefined1 *)(plVar7 + 6) = 0;
  plVar7[0xd] = 0;
  plVar7[0xe] = 0;
  plVar7[0xf] = 0;
  *(undefined4 *)(plVar7 + 0x10) = promiseAndPipeline.promise.super_PromiseBase.node.ptr._0_4_;
  *(undefined4 *)((long)plVar7 + 0x84) = promiseAndPipeline.promise.super_PromiseBase.node.ptr._4_4_
  ;
  *(undefined4 *)(plVar7 + 0x11) = uVar5;
  *(undefined4 *)((long)plVar7 + 0x8c) = uVar6;
  plVar7[0x12] = 0;
  plVar7[0x13] = 0;
  *(CallHints *)(plVar7 + 0x14) = CVar1;
  *(bool *)((long)plVar7 + 0xa2) = isStreaming;
  *(undefined4 *)(plVar7 + 3) = 1;
  uVar3 = this->interfaceId;
  pCVar4 = (this->client).ptr;
  uVar2 = this->methodId;
  *(int *)(plVar7 + 3) = (int)plVar7[3] + 1;
  f.exception = (Exception *)(plVar7 + 2);
  (*pCVar4->_vptr_ClientHook[1])
            (&promiseAndPipeline,pCVar4,uVar3,(ulong)uVar2,&f,(ulong)(ushort)this->hints);
  if (plVar7 != (long *)0x0) {
    (**(code **)((f.exception)->ownFile).content.ptr)
              (f.exception,(long)plVar7 + *(long *)(*plVar7 + -0x10));
  }
  continuationTracePtr =
       kj::_::
       SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability.c++:271:52)>
       ::anon_class_16_1_bc11688f_for_func::operator();
  f.exception = (Exception *)(plVar7 + 2);
  kj::_::PromiseDisposer::
  appendPromise<kj::_::SimpleTransformPromiseNode<void,capnp::LocalRequest::sendImpl(bool)::_lambda()_1_>,kj::_::PromiseDisposer,capnp::LocalRequest::sendImpl(bool)::_lambda()_1_,void*&>
            ((PromiseDisposer *)&local_38,(OwnPromiseNode *)&promiseAndPipeline,
             (anon_class_16_1_bc11688f_for_func *)&f,&continuationTracePtr);
  if (plVar7 != (long *)0x0) {
    (**(code **)((f.exception)->ownFile).content.ptr)
              (f.exception,(long)plVar7 + *(long *)(*plVar7 + -0x10));
  }
  node.super_PromiseBase.node.ptr = promiseAndPipeline.promise.super_PromiseBase.node.ptr;
  (__return_storage_ptr__->super_Promise<capnp::Response<capnp::AnyPointer>_>).super_PromiseBase.
  node.ptr = local_38;
  (__return_storage_ptr__->super_Pipeline).hook.disposer = promiseAndPipeline.pipeline.disposer;
  (__return_storage_ptr__->super_Pipeline).hook.ptr = promiseAndPipeline.pipeline.ptr;
  (__return_storage_ptr__->super_Pipeline).ops.ptr = (PipelineOp *)0x0;
  (__return_storage_ptr__->super_Pipeline).ops.size_ = 0;
  (__return_storage_ptr__->super_Pipeline).ops.disposer = (ArrayDisposer *)0x0;
  promiseAndPipeline.pipeline.ptr = (PipelineHook *)0x0;
  if (promiseAndPipeline.promise.super_PromiseBase.node.ptr != (OwnPromiseNode)0x0) {
    promiseAndPipeline.promise.super_PromiseBase.node.ptr = (PromiseBase)(OwnPromiseNode)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)node.super_PromiseBase.node.ptr);
  }
  return __return_storage_ptr__;
}

Assistant:

QueuedPipeline(kj::Promise<kj::Own<PipelineHook>>&& promiseParam)
      : promise(promiseParam.fork()),
        selfResolutionOp(promise.addBranch().then([this](kj::Own<PipelineHook>&& inner) {
          redirect = kj::mv(inner);
        }, [this](kj::Exception&& exception) {
          redirect = newBrokenPipeline(kj::mv(exception));
        }).eagerlyEvaluate(nullptr)) {}